

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_sync.cpp
# Opt level: O2

void Session(socket *socket)

{
  ulong_long_type uVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  system_error *this;
  error_code eVar5;
  error_code ec;
  mutable_buffer local_440;
  array<char,_1024UL> data;
  
  do {
    ec.val_ = 0;
    ec._4_4_ = ec._4_4_ & 0xffffff00;
    ec.cat_ = boost::system::system_category();
    local_440.size_ = 0x400;
    local_440.data_ = &data;
    sVar3 = boost::asio::
            basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::read_some<boost::asio::mutable_buffer>(socket,&local_440,&ec);
    eVar5 = boost::asio::error::make_error_code(eof);
    if (ec.val_ == eVar5.val_) {
      uVar1 = (eVar5.cat_)->id_;
      bVar2 = (ec.cat_)->id_ == uVar1;
      if (uVar1 == 0) {
        bVar2 = ec.cat_ == eVar5.cat_;
      }
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Connection closed cleanly by peer.");
        std::endl<char,std::char_traits<char>>(poVar4);
        return;
      }
    }
    if (ec.failed_ == true) {
      this = (system_error *)__cxa_allocate_exception(0x40);
      eVar5.failed_ = ec.failed_;
      eVar5._5_3_ = ec._5_3_;
      eVar5.val_ = ec.val_;
      eVar5.cat_ = ec.cat_;
      boost::system::system_error::system_error(this,eVar5);
      __cxa_throw(this,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    if (0x3ff < sVar3) {
      sVar3 = 0x400;
    }
    local_440.data_ = &data;
    local_440.size_ = sVar3;
    boost::asio::
    write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer>
              (socket,&local_440,(type *)0x0);
  } while( true );
}

Assistant:

void Session(tcp::socket socket) {
  try {
    while (true) {
      std::array<char, BUF_SIZE> data;

      boost::system::error_code ec;
      std::size_t length = socket.read_some(boost::asio::buffer(data), ec);

      if (ec == boost::asio::error::eof) {
        std::cout << "Connection closed cleanly by peer." << std::endl;
        break;
      } else if (ec) {
        // Some other error
        throw boost::system::system_error(ec);
      }

      boost::asio::write(socket, boost::asio::buffer(data, length));
    }
  } catch (const std::exception& e) {
    std::cerr << "Exception: " <<  e.what() << std::endl;
  }
}